

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkUtil.c
# Opt level: O0

int Nwk_NodeCompareLevelsIncrease(Nwk_Obj_t **pp1,Nwk_Obj_t **pp2)

{
  int iVar1;
  int Diff;
  Nwk_Obj_t **pp2_local;
  Nwk_Obj_t **pp1_local;
  
  iVar1 = (*pp1)->Level - (*pp2)->Level;
  if (iVar1 < 0) {
    pp1_local._4_4_ = -1;
  }
  else if (iVar1 < 1) {
    pp1_local._4_4_ = 0;
  }
  else {
    pp1_local._4_4_ = 1;
  }
  return pp1_local._4_4_;
}

Assistant:

int Nwk_NodeCompareLevelsIncrease( Nwk_Obj_t ** pp1, Nwk_Obj_t ** pp2 )
{
    int Diff = (*pp1)->Level - (*pp2)->Level;
    if ( Diff < 0 )
        return -1;
    if ( Diff > 0 ) 
        return 1;
    return 0; 
}